

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCreateEvent
                    (CPalThread *pthr,LPSECURITY_ATTRIBUTES lpEventAttributes,BOOL bManualReset,
                    BOOL bInitialState,LPCWSTR lpName,HANDLE *phEvent)

{
  uint uVar1;
  undefined1 *puVar2;
  long *local_68;
  ISynchStateController *pssc;
  IPalObject *pobjRegisteredEvent;
  IPalObject *pobjEvent;
  undefined1 local_48 [4];
  PAL_ERROR palError;
  CObjectAttributes oa;
  HANDLE *phEvent_local;
  LPCWSTR lpName_local;
  BOOL bInitialState_local;
  BOOL bManualReset_local;
  LPSECURITY_ATTRIBUTES lpEventAttributes_local;
  CPalThread *pthr_local;
  
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)phEvent;
  CObjectAttributes::CObjectAttributes((CObjectAttributes *)local_48,lpName,lpEventAttributes);
  pobjEvent._4_4_ = 0;
  pobjRegisteredEvent = (IPalObject *)0x0;
  pssc = (ISynchStateController *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xdd);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (oa.pSecurityAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xde);
    fprintf(_stderr,"Expression: NULL != phEvent\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (lpName == (LPCWSTR)0x0) {
    puVar2 = otAutoResetEvent;
    if (bManualReset != 0) {
      puVar2 = otManualResetEvent;
    }
    pobjEvent._4_4_ =
         (**(code **)*g_pObjectManager)(g_pObjectManager,pthr,puVar2,local_48,&pobjRegisteredEvent);
    if (pobjEvent._4_4_ == 0) {
      uVar1 = 0;
      if (bInitialState != 0) {
        pobjEvent._4_4_ =
             (*pobjRegisteredEvent->_vptr_IPalObject[5])(pobjRegisteredEvent,pthr,&local_68);
        if (pobjEvent._4_4_ == 0) {
          pobjEvent._4_4_ = (**(code **)(*local_68 + 8))(local_68,1);
          (**(code **)(*local_68 + 0x30))();
        }
        uVar1 = pobjEvent._4_4_;
        if (pobjEvent._4_4_ != 0) {
          fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
                  ,0x10e);
          fprintf(_stderr,"Unable to set new event state (%d)\n",(ulong)pobjEvent._4_4_);
          goto LAB_003b85dd;
        }
      }
      pobjEvent._4_4_ = uVar1;
      pobjEvent._4_4_ =
           (**(code **)(*g_pObjectManager + 8))
                     (g_pObjectManager,pthr,pobjRegisteredEvent,&aotEvent,0x1f0003,
                      oa.pSecurityAttributes,&pssc);
      pobjRegisteredEvent = (IPalObject *)0x0;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xec);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    pobjEvent._4_4_ = 0x32;
  }
LAB_003b85dd:
  if (pobjRegisteredEvent != (IPalObject *)0x0) {
    (*pobjRegisteredEvent->_vptr_IPalObject[8])(pobjRegisteredEvent,pthr);
  }
  if (pssc != (ISynchStateController *)0x0) {
    (*pssc->_vptr_ISynchStateController[8])(pssc,pthr);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pobjEvent._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateEvent(
    CPalThread *pthr,
    LPSECURITY_ATTRIBUTES lpEventAttributes,
    BOOL bManualReset,
    BOOL bInitialState,
    LPCWSTR lpName,
    HANDLE *phEvent
    )
{
    CObjectAttributes oa(lpName, lpEventAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjEvent = NULL;
    IPalObject *pobjRegisteredEvent = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phEvent);

    ENTRY("InternalCreateEvent(pthr=%p, lpEventAttributes=%p, bManualReset=%i, "
        "bInitialState=%i, lpName=%p, phEvent=%p)\n",
        pthr,
        lpEventAttributes,
        bManualReset,
        bInitialState,
        lpName,
        phEvent
        );

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto InternalCreateEventExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pthr,
        bManualReset ? &otManualResetEvent : &otAutoResetEvent,
        &oa,
        &pobjEvent
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateEventExit;
    }

    if (bInitialState)
    {
        ISynchStateController *pssc;

        palError = pobjEvent->GetSynchStateController(
            pthr,
            &pssc
            );

        if (NO_ERROR == palError)
        {
            palError = pssc->SetSignalCount(1);
            pssc->ReleaseController();
        }

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to set new event state (%d)\n", palError);
            goto InternalCreateEventExit;
        }
    }

    palError = g_pObjectManager->RegisterObject(
        pthr,
        pobjEvent,
        &aotEvent, 
        EVENT_ALL_ACCESS, // Currently ignored (no Win32 security)
        phEvent,
        &pobjRegisteredEvent
        );

    //
    // pobjEvent is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //
    
    pobjEvent = NULL;

InternalCreateEventExit:

    if (NULL != pobjEvent)
    {
        pobjEvent->ReleaseReference(pthr);
    }

    if (NULL != pobjRegisteredEvent)
    {
        pobjRegisteredEvent->ReleaseReference(pthr);
    }

    LOGEXIT("InternalCreateEvent returns %i\n", palError);

    return palError;
}